

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O3

void duckdb::InsertToken(tokenType insert_type,idx_t insert_pos,
                        vector<duckdb::highlightToken,_true> *tokens)

{
  size_t sVar1;
  bool bVar2;
  undefined7 uVar3;
  size_type sVar4;
  reference pvVar5;
  undefined7 in_register_00000039;
  pointer phVar6;
  ulong __n;
  size_type __n_00;
  vector<duckdb::highlightToken,_true> new_tokens;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> local_68;
  highlightToken local_50;
  undefined4 local_34;
  
  local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_finish = (highlightToken *)0x0;
  local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
            (&local_68,
             ((long)(tokens->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(tokens->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1);
  local_34 = (undefined4)CONCAT71(in_register_00000039,insert_type);
  if ((tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar2 = false;
    __n = 0;
  }
  else {
    sVar4 = 0;
    do {
      __n_00 = sVar4;
      pvVar5 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n_00);
      if (pvVar5->start == insert_pos) {
        local_50.search_match = false;
        if (local_68.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_68.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_50.type = insert_type;
          local_50.start = insert_pos;
          ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
          _M_realloc_insert<duckdb::highlightToken_const&>
                    ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                     &local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          *(ulong *)&(local_68.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->search_match =
               (ulong)(uint7)local_50._17_7_ << 8;
          *(ulong *)local_68.
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
               CONCAT71(local_50._1_7_,insert_type);
          (local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->start = insert_pos;
          local_68.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
          local_50.type = insert_type;
          local_50.start = insert_pos;
        }
        __n = __n_00 + 1;
        if (((ulong)(((long)(tokens->
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ).
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(tokens->
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ).
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
             <= __n) ||
           (pvVar5 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n),
           insert_pos + 1 < pvVar5->start)) {
          local_50.start = insert_pos + 1;
          pvVar5 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n_00);
          local_50.type = pvVar5->type;
          local_50.search_match = false;
          if (local_68.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_68.
              super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
            _M_realloc_insert<duckdb::highlightToken_const&>
                      ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                       &local_68,
                       (iterator)
                       local_68.
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_50);
          }
          else {
            *(ulong *)&(local_68.
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->search_match =
                 (ulong)(uint7)local_50._17_7_ << 8;
            *(ulong *)local_68.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                 CONCAT71(local_50._1_7_,local_50.type);
            (local_68.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start = local_50.start;
            local_68.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_68.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        bVar2 = true;
        goto LAB_0021a213;
      }
      pvVar5 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n_00);
      if (insert_pos < pvVar5->start) {
        local_50.search_match = false;
        if (local_68.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_68.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_50.type = insert_type;
          local_50.start = insert_pos;
          ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
          _M_realloc_insert<duckdb::highlightToken_const&>
                    ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                     &local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          *(ulong *)&(local_68.
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->search_match =
               (ulong)(uint7)local_50._17_7_ << 8;
          *(ulong *)local_68.
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
               CONCAT71(local_50._1_7_,insert_type);
          (local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->start = insert_pos;
          local_68.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
          local_50.type = insert_type;
          local_50.start = insert_pos;
        }
        pvVar5 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n_00);
        if (local_68.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_68.
            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
          _M_realloc_insert<duckdb::highlightToken_const&>
                    ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                     &local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_finish,pvVar5);
        }
        else {
          uVar3 = *(undefined7 *)&pvVar5->field_0x11;
          (local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->search_match = pvVar5->search_match;
          *(undefined7 *)
           &(local_68.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar3;
          uVar3 = *(undefined7 *)&pvVar5->field_0x1;
          sVar1 = pvVar5->start;
          (local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->type = pvVar5->type;
          *(undefined7 *)
           &(local_68.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar3;
          (local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->start = sVar1;
          local_68.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        bVar2 = true;
        goto LAB_0021a1fe;
      }
      pvVar5 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n_00);
      if (local_68.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_68.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
        _M_realloc_insert<duckdb::highlightToken_const&>
                  ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                   &local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish,pvVar5);
      }
      else {
        uVar3 = *(undefined7 *)&pvVar5->field_0x11;
        (local_68.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->search_match = pvVar5->search_match;
        *(undefined7 *)
         &(local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar3;
        uVar3 = *(undefined7 *)&pvVar5->field_0x1;
        sVar1 = pvVar5->start;
        (local_68.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->type = pvVar5->type;
        *(undefined7 *)
         &(local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar3;
        (local_68.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->start = sVar1;
        local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      sVar4 = __n_00 + 1;
    } while (__n_00 + 1 <
             (ulong)(((long)(tokens->
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ).
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(tokens->
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ).
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
    bVar2 = false;
LAB_0021a1fe:
    __n = __n_00 + 1;
  }
LAB_0021a213:
  phVar6 = (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (__n < (ulong)(((long)(tokens->
                           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ).
                           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)phVar6 >> 3) *
                   -0x5555555555555555)) {
    do {
      pvVar5 = vector<duckdb::highlightToken,_true>::operator[](tokens,__n);
      if (local_68.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_68.
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
        _M_realloc_insert<duckdb::highlightToken_const&>
                  ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                   &local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish,pvVar5);
      }
      else {
        uVar3 = *(undefined7 *)&pvVar5->field_0x11;
        (local_68.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->search_match = pvVar5->search_match;
        *(undefined7 *)
         &(local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar3;
        uVar3 = *(undefined7 *)&pvVar5->field_0x1;
        sVar1 = pvVar5->start;
        (local_68.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->type = pvVar5->type;
        *(undefined7 *)
         &(local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish)->field_0x1 = uVar3;
        (local_68.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_finish)->start = sVar1;
        local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      __n = __n + 1;
      phVar6 = (tokens->
               super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (__n < (ulong)(((long)(tokens->
                                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ).
                                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)phVar6 >> 3) *
                          -0x5555555555555555));
  }
  if (!bVar2) {
    local_50.type = (tokenType)local_34;
    local_50.search_match = false;
    if (local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_50.start = insert_pos;
      ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
      _M_realloc_insert<duckdb::highlightToken_const&>
                ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)&local_68,
                 (iterator)
                 local_68.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_50);
    }
    else {
      *(ulong *)&(local_68.
                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->search_match =
           (ulong)(uint7)local_50._17_7_ << 8;
      *(ulong *)local_68.
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                _M_impl.super__Vector_impl_data._M_finish = CONCAT71(local_50._1_7_,local_50.type);
      (local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_finish)->start = insert_pos;
      local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_68.
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
      local_50.start = insert_pos;
    }
    phVar6 = (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>)
             .super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((phVar6 != (pointer)0x0) &&
     (operator_delete(phVar6),
     local_68.super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_68.
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InsertToken(tokenType insert_type, idx_t insert_pos, vector<highlightToken> &tokens) {
	vector<highlightToken> new_tokens;
	new_tokens.reserve(tokens.size() + 1);
	idx_t i;
	bool found = false;
	for (i = 0; i < tokens.size(); i++) {
		// find the exact position where we need to insert the token
		if (tokens[i].start == insert_pos) {
			// this token is exactly at this render position

			// insert highlighting for the bracket
			highlightToken token;
			token.start = insert_pos;
			token.type = insert_type;
			token.search_match = false;
			new_tokens.push_back(token);

			// now we need to insert the other token ONLY if the other token is not immediately following this one
			if (i + 1 >= tokens.size() || tokens[i + 1].start > insert_pos + 1) {
				token.start = insert_pos + 1;
				token.type = tokens[i].type;
				token.search_match = false;
				new_tokens.push_back(token);
			}
			i++;
			found = true;
			break;
		} else if (tokens[i].start > insert_pos) {
			// the next token is AFTER the render position
			// insert highlighting for the bracket
			highlightToken token;
			token.start = insert_pos;
			token.type = insert_type;
			token.search_match = false;
			new_tokens.push_back(token);

			// now just insert the next token
			new_tokens.push_back(tokens[i]);
			i++;
			found = true;
			break;
		} else {
			// insert the token
			new_tokens.push_back(tokens[i]);
		}
	}
	// copy over the remaining tokens
	for (; i < tokens.size(); i++) {
		new_tokens.push_back(tokens[i]);
	}
	if (!found) {
		// token was not added - add it to the end
		highlightToken token;
		token.start = insert_pos;
		token.type = insert_type;
		token.search_match = false;
		new_tokens.push_back(token);
	}
	tokens = std::move(new_tokens);
}